

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
CLI::Config::to_flag_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Config *this,ConfigItem *item)

{
  code *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  unsigned_long __n;
  ConversionError *__return_storage_ptr___00;
  string local_f8 [2];
  invalid_argument *anon_var_0;
  unsigned_long local_a0;
  size_t ui;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8d [13];
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string val;
  ConfigItem *item_local;
  Config *this_local;
  
  val.field_2._8_8_ = item;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&item->inputs);
  if (sVar3 != 1) {
    __return_storage_ptr___00 = (ConversionError *)__cxa_allocate_exception(0x38);
    ConfigItem::fullname_abi_cxx11_(local_f8,(ConfigItem *)val.field_2._8_8_);
    ConversionError::TooManyInputsFlag(__return_storage_ptr___00,local_f8);
    __cxa_throw(__return_storage_ptr___00,&ConversionError::typeinfo,
                ConversionError::~ConversionError);
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(val.field_2._8_8_ + 0x38),0);
  ::std::__cxx11::string::string((string *)local_40,(string *)pvVar4);
  ::std::__cxx11::string::string((string *)&local_80,(string *)local_40);
  detail::to_lower(&local_60,&local_80);
  ::std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"true");
  if (!bVar2) {
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"on");
    if (!bVar2) {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"yes");
      if (!bVar2) {
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"false");
        if (!bVar2) {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"off");
          if (!bVar2) {
            bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"no");
            if (!bVar2) {
              __n = std::__cxx11::stoul((string *)local_40,(size_t *)0x0,10);
              local_a0 = __n;
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&anon_var_0 + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(__return_storage_ptr__,__n,
                       (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)&anon_var_0 + 7));
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&anon_var_0 + 7));
              goto LAB_00112b3a;
            }
          }
        }
        memset(__return_storage_ptr__,0,0x18);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(__return_storage_ptr__);
        goto LAB_00112b3a;
      }
    }
  }
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_8d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,1,local_8d);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_8d);
LAB_00112b3a:
  ui._4_4_ = 1;
  ::std::__cxx11::string::~string((string *)local_40);
  if (ui._4_4_ != 0) {
    return __return_storage_ptr__;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual std::vector<std::string> to_flag(const ConfigItem &item) const {
        if(item.inputs.size() == 1) {
            std::string val = item.inputs.at(0);
            val = detail::to_lower(val);

            if(val == "true" || val == "on" || val == "yes") {
                return std::vector<std::string>(1);
            } else if(val == "false" || val == "off" || val == "no") {
                return std::vector<std::string>();
            } else {
                try {
                    size_t ui = std::stoul(val);
                    return std::vector<std::string>(ui);
                } catch(const std::invalid_argument &) {
                    throw ConversionError::TrueFalse(item.fullname());
                }
            }
        } else {
            throw ConversionError::TooManyInputsFlag(item.fullname());
        }
    }